

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way<true,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  unsigned_short *cache_input_00;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  uchar **ppuVar7;
  uchar *puVar8;
  unsigned_short uVar9;
  ulong uVar10;
  unsigned_short *cache_output_00;
  ulong uVar11;
  uchar **ppuVar12;
  lcp_t lVar13;
  uchar uVar14;
  byte bVar15;
  uint uVar16;
  byte bVar17;
  uchar uVar18;
  long lVar19;
  size_t n_00;
  
  if (0x1f < n) {
    uVar11 = n >> 1;
    MVar5 = mergesort_cache_lcp_2way<true,unsigned_short>
                      (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                       uVar11);
    uVar10 = n & 0xfffffffffffffffe;
    cache_input_00 = (unsigned_short *)((long)cache_input + uVar10);
    cache_output_00 = (unsigned_short *)(uVar10 + (long)cache_output);
    n_00 = n - uVar11;
    ppuVar7 = strings_input + uVar11;
    ppuVar12 = strings_output + uVar11;
    lcp_input_00 = lcp_input + uVar11;
    lcp_output_00 = lcp_output + uVar11;
    if (MVar5 == SortedInPlace) {
      check_input<unsigned_short>(strings_input,lcp_input,cache_input,uVar11);
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_short>
                        (ppuVar7,ppuVar12,lcp_input_00,lcp_output_00,cache_input_00,cache_output_00,
                         n_00);
      check_input<unsigned_short>(ppuVar7,lcp_input_00,cache_input_00,n_00);
      if (MVar6 == SortedInPlace) {
        merge_cache_lcp_2way<true,unsigned_short>
                  (strings_input,lcp_input,cache_input,uVar11,ppuVar7,lcp_input_00,cache_input_00,
                   n_00,strings_output,lcp_output,cache_output);
        return SortedInTemp;
      }
      memmove(strings_output,strings_input,uVar11 * 8);
      memcpy(cache_output,cache_input,uVar10);
      memcpy(lcp_output,lcp_input,uVar11 * 8);
      MVar5 = SortedInTemp;
    }
    else {
      check_input<unsigned_short>(strings_output,lcp_output,cache_output,uVar11);
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_short>
                        (ppuVar7,ppuVar12,lcp_input_00,lcp_output_00,cache_input_00,cache_output_00,
                         n_00);
      check_input<unsigned_short>(ppuVar12,lcp_output_00,cache_output_00,n_00);
      if (MVar5 == MVar6) goto LAB_001d7100;
      memmove(strings_input,strings_output,uVar11 * 8);
      memcpy(cache_input,cache_output,uVar10);
      memcpy(lcp_input,lcp_output,uVar11 * 8);
      MVar6 = SortedInTemp;
    }
    if (MVar5 != MVar6) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x56e,
                    "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
LAB_001d7100:
    merge_cache_lcp_2way<true,unsigned_short>
              (strings_output,lcp_output,cache_output,uVar11,ppuVar12,lcp_output_00,cache_output_00,
               n_00,strings_input,lcp_input,cache_input);
    return SortedInPlace;
  }
  if (1 < n) {
    uVar10 = n & 0xffffffff;
    ppuVar7 = strings_input;
    do {
      pbVar1 = ppuVar7[1];
      ppuVar7 = ppuVar7 + 1;
      for (ppuVar12 = ppuVar7; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
        pbVar2 = ppuVar12[-1];
        bVar15 = *pbVar2;
        bVar17 = *pbVar1;
        if (bVar15 != 0 && bVar15 == bVar17) {
          lVar19 = 1;
          do {
            bVar15 = pbVar2[lVar19];
            bVar17 = pbVar1[lVar19];
            if (bVar15 == 0) break;
            lVar19 = lVar19 + 1;
          } while (bVar15 == bVar17);
        }
        if (bVar15 <= bVar17) break;
        *ppuVar12 = pbVar2;
      }
      iVar4 = (int)uVar10;
      *ppuVar12 = pbVar1;
      uVar10 = (ulong)(iVar4 - 1);
    } while (2 < iVar4);
  }
  puVar3 = *strings_input;
  puVar8 = strings_input[1];
  uVar18 = *puVar3;
  if (uVar18 == '\0') {
    *lcp_input = 0;
  }
  else {
    lVar13 = 0;
    uVar14 = uVar18;
    do {
      if (uVar14 != puVar8[lVar13]) break;
      uVar14 = puVar3[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while (uVar14 != '\0');
    *lcp_input = lVar13;
    if (uVar18 != '\0') {
      uVar9 = CONCAT11(uVar18,puVar3[1]);
      goto LAB_001d6f7c;
    }
  }
  uVar9 = 0;
LAB_001d6f7c:
  *cache_input = uVar9;
  if (1 < n - 1) {
    uVar10 = 1;
    uVar16 = 1;
    do {
      uVar11 = (ulong)(uVar16 + 1);
      puVar3 = strings_input[uVar11];
      lVar13 = 0;
      uVar18 = *puVar8;
      while ((uVar18 != '\0' && (uVar18 == puVar3[lVar13]))) {
        lVar19 = lVar13 + 1;
        lVar13 = lVar13 + 1;
        uVar18 = puVar8[lVar19];
      }
      lcp_input[uVar10] = lVar13;
      if (puVar8[lcp_input[uVar16 - 1]] == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = CONCAT11(puVar8[lcp_input[uVar16 - 1]],puVar8[lcp_input[uVar16 - 1] + 1]);
      }
      cache_input[uVar10] = uVar9;
      puVar8 = puVar3;
      uVar10 = uVar11;
      uVar16 = uVar16 + 1;
    } while (uVar11 < n - 1);
  }
  puVar3 = strings_input[n - 1];
  if (puVar3 != (uchar *)0x0) {
    if (puVar3[lcp_input[n - 2]] == '\0') {
      uVar9 = 0;
    }
    else {
      uVar9 = CONCAT11(puVar3[lcp_input[n - 2]],puVar3[lcp_input[n - 2] + 1]);
    }
    cache_input[n - 1] = uVar9;
    check_input<unsigned_short>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}